

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O3

bool __thiscall
ON_3dmObjectAttributes::FindDisplayMaterialId
          (ON_3dmObjectAttributes *this,ON_UUID *viewport_id,ON_UUID *display_material_id)

{
  bool bVar1;
  ON_DisplayMaterialRef found_material;
  ON_DisplayMaterialRef search_material;
  ON_DisplayMaterialRef OStack_68;
  ON_DisplayMaterialRef local_48;
  
  if (0 < (this->m_dmref).m_count) {
    ON_DisplayMaterialRef::ON_DisplayMaterialRef(&local_48);
    ON_DisplayMaterialRef::ON_DisplayMaterialRef(&OStack_68);
    local_48.m_viewport_id.Data1 = viewport_id->Data1;
    local_48.m_viewport_id.Data2 = viewport_id->Data2;
    local_48.m_viewport_id.Data3 = viewport_id->Data3;
    local_48.m_viewport_id.Data4 = *&viewport_id->Data4;
    bVar1 = FindDisplayMaterialRef(this,&local_48,&OStack_68);
    if (display_material_id != (ON_UUID *)0x0 && bVar1) {
      display_material_id->Data1 = OStack_68.m_display_material_id.Data1;
      display_material_id->Data2 = OStack_68.m_display_material_id.Data2;
      display_material_id->Data3 = OStack_68.m_display_material_id.Data3;
      *&display_material_id->Data4 = OStack_68.m_display_material_id.Data4;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool ON_3dmObjectAttributes::FindDisplayMaterialId( 
      const ON_UUID& viewport_id, 
      ON_UUID* display_material_id
      ) const
{
  bool rc = false;
  if ( m_dmref.Count() > 0 )
  {
    ON_DisplayMaterialRef search_material, found_material;
    search_material.m_viewport_id = viewport_id;
    if ( 0 != (rc = FindDisplayMaterialRef(search_material,&found_material)) )
    {
      if ( display_material_id )
        *display_material_id = found_material.m_display_material_id;
    }
  }
  return rc;
}